

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O0

void __thiscall
VideoEngine::VideoEngine
          (VideoEngine *this,Resources *resources,shared_ptr<renderdesc::Pipeline> *pipeline)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  element_type *peVar4;
  ulong uVar5;
  PolledTexture *this_00;
  __shared_ptr_access<PolledTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  Texture *tex;
  reference pPVar6;
  size_type sVar7;
  reference __args_1;
  reference __args_2;
  Program *p;
  iterator __end1_3;
  iterator __begin1_3;
  vector<renderdesc::Program,_std::allocator<renderdesc::Program>_> *__range1_3;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  int index;
  int i;
  Framebuffer fb;
  Framebuffer *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_> *__range1_1;
  shared_ptr<PolledTexture> local_50;
  pointer local_40;
  Texture *t;
  iterator __end1;
  iterator __begin1;
  vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_> *__range1;
  shared_ptr<renderdesc::Pipeline> *pipeline_local;
  Resources *resources_local;
  VideoEngine *this_local;
  
  this->resources_ = resources;
  std::shared_ptr<renderdesc::Pipeline>::shared_ptr(&this->pipeline_,pipeline);
  std::vector<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>::
  vector(&this->textures_);
  std::vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>::vector
            (&this->framebuffer_);
  std::
  vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ::vector(&this->sources_);
  std::vector<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>::vector(&this->programs_);
  std::unique_ptr<VideoEngine::Canvas,std::default_delete<VideoEngine::Canvas>>::
  unique_ptr<std::default_delete<VideoEngine::Canvas>,void>
            ((unique_ptr<VideoEngine::Canvas,std::default_delete<VideoEngine::Canvas>> *)
             &this->canvas_);
  peVar4 = std::__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pipeline);
  __end1 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::begin
                     (&peVar4->textures);
  t = (Texture *)
      std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::end(&peVar4->textures)
  ;
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<renderdesc::Texture_*,_std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>_>
                                *)&t);
    if (!bVar3) break;
    local_40 = (pointer)__gnu_cxx::
                        __normal_iterator<renderdesc::Texture_*,_std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>_>
                        ::operator*(&__end1);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Resources::getTexture((Resources *)&__range1_1,(string *)this->resources_);
      std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
      emplace_back<std::shared_ptr<PolledTexture>>
                ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                  *)&this->textures_,(shared_ptr<PolledTexture> *)&__range1_1);
      std::shared_ptr<PolledTexture>::~shared_ptr((shared_ptr<PolledTexture> *)&__range1_1);
    }
    else {
      this_00 = (PolledTexture *)operator_new(0x28);
      PolledTexture::PolledTexture
                (this_00,*(int *)&(local_40->super_path)._M_pathname,
                 *(int *)&(local_40->super_path)._M_pathname.field_0x4,
                 *(PixelType *)&(local_40->super_path)._M_pathname._M_string_length);
      std::shared_ptr<PolledTexture>::shared_ptr<PolledTexture,void>(&local_50,this_00);
      std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
      emplace_back<std::shared_ptr<PolledTexture>>
                ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                  *)&this->textures_,&local_50);
      std::shared_ptr<PolledTexture>::~shared_ptr(&local_50);
    }
    __gnu_cxx::
    __normal_iterator<renderdesc::Texture_*,_std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>_>
    ::operator++(&__end1);
  }
  peVar4 = std::__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pipeline);
  __end1_1 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::begin
                       (&peVar4->framebuffers);
  f = (Framebuffer *)
      std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::end
                (&peVar4->framebuffers);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<renderdesc::Framebuffer_*,_std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>_>
                        *)&f);
    if (!bVar3) break;
    fb._8_8_ = __gnu_cxx::
               __normal_iterator<renderdesc::Framebuffer_*,_std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>_>
               ::operator*(&__end1_1);
    Framebuffer::Framebuffer((Framebuffer *)&index);
    glBindFramebuffer(0x8d40,fb.h);
    GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb.name)");
    for (__range1_2._4_4_ = 0; (int)__range1_2._4_4_ < *(int *)fb._8_8_;
        __range1_2._4_4_ = __range1_2._4_4_ + 1) {
      uVar2 = *(uint *)(fb._8_8_ + 4 + (long)(int)__range1_2._4_4_ * 4);
      if ((int)uVar2 < 0) {
LAB_0018a84e:
        sVar7 = std::
                vector<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                ::size(&this->textures_);
        aAppDebugPrintf("[CRASH] Fb texture %d OOB %d (max %d)",(ulong)__range1_2._4_4_,(ulong)uVar2
                        ,sVar7 & 0xffffffff);
        aAppTerminate(-1);
      }
      else {
        sVar7 = std::
                vector<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                ::size(&this->textures_);
        if ((int)sVar7 <= (int)uVar2) goto LAB_0018a84e;
      }
      this_01 = (__shared_ptr_access<PolledTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::
                vector<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                ::operator[](&this->textures_,(long)(int)uVar2);
      this_02 = std::__shared_ptr_access<PolledTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_01);
      tex = PolledTexture::texture(this_02);
      bVar3 = Framebuffer::attachColorTexture((Framebuffer *)&index,__range1_2._4_4_,tex);
      if (!bVar3) {
        sVar7 = std::vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>::
                size(&this->framebuffer_);
        aAppDebugPrintf("[CRASH] Framebuffer %d is not complete",sVar7 & 0xffffffff);
        aAppTerminate(-1);
      }
    }
    fb.w = *(int *)fb._8_8_;
    std::vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>::push_back
              (&this->framebuffer_,(value_type *)&index);
    Framebuffer::~Framebuffer((Framebuffer *)&index);
    __gnu_cxx::
    __normal_iterator<renderdesc::Framebuffer_*,_std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>_>
    ::operator++(&__end1_1);
  }
  glBindFramebuffer(0x8d40,0);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, 0)");
  peVar4 = std::__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pipeline);
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&peVar4->shader_filenames);
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&peVar4->shader_filenames);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&s);
    if (!bVar3) break;
    local_c8 = (undefined1  [8])
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_2);
    Resources::getShaderSource((Resources *)&__range1_3,(string *)this->resources_);
    std::
    vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
    ::emplace_back<std::shared_ptr<PolledShaderSource>>
              ((vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
                *)&this->sources_,(shared_ptr<PolledShaderSource> *)&__range1_3);
    std::shared_ptr<PolledShaderSource>::~shared_ptr((shared_ptr<PolledShaderSource> *)&__range1_3);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  peVar4 = std::__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pipeline);
  __end1_3 = std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>::begin
                       (&peVar4->programs);
  p = (Program *)
      std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>::end(&peVar4->programs)
  ;
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<renderdesc::Program_*,_std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>_>
                        *)&p);
    if (!bVar3) {
      return;
    }
    pPVar6 = __gnu_cxx::
             __normal_iterator<renderdesc::Program_*,_std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>_>
             ::operator*(&__end1_3);
    if (pPVar6->vertex < 0) {
LAB_0018ab67:
      uVar2 = pPVar6->vertex;
      sVar7 = std::
              vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ::size(&this->sources_);
      aAppDebugPrintf("[CRASH] Program vertex source OOB %d (max %d)",(ulong)uVar2,
                      sVar7 & 0xffffffff);
      aAppTerminate(-1);
    }
    else {
      iVar1 = pPVar6->vertex;
      sVar7 = std::
              vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ::size(&this->sources_);
      if ((int)sVar7 <= iVar1) goto LAB_0018ab67;
    }
    if (pPVar6->fragment < 0) {
LAB_0018abec:
      uVar2 = pPVar6->fragment;
      sVar7 = std::
              vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ::size(&this->sources_);
      aAppDebugPrintf("[CRASH] Program fragment source OOB %d (max %d)",(ulong)uVar2,
                      sVar7 & 0xffffffff);
      aAppTerminate(-1);
    }
    else {
      iVar1 = pPVar6->fragment;
      sVar7 = std::
              vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ::size(&this->sources_);
      if ((int)sVar7 <= iVar1) goto LAB_0018abec;
    }
    __args_1 = std::
               vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
               ::operator[](&this->sources_,(long)pPVar6->vertex);
    __args_2 = std::
               vector<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
               ::operator[](&this->sources_,(long)pPVar6->fragment);
    std::vector<PolledShaderProgram,std::allocator<PolledShaderProgram>>::
    emplace_back<Expected<std::__cxx11::string,std::__cxx11::string>(&)(shader::Source_const&),std::shared_ptr<PolledShaderSource>&,std::shared_ptr<PolledShaderSource>&>
              ((vector<PolledShaderProgram,std::allocator<PolledShaderProgram>> *)&this->programs_,
               shaderPreprocessor_abi_cxx11_,__args_1,__args_2);
    __gnu_cxx::
    __normal_iterator<renderdesc::Program_*,_std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>_>
    ::operator++(&__end1_3);
  } while( true );
}

Assistant:

VideoEngine::VideoEngine(Resources &resources, const std::shared_ptr<renderdesc::Pipeline> &pipeline)
	: resources_(resources)
	, pipeline_(pipeline)
{
	for (const auto& t: pipeline->textures) {
		if (t.file.empty()) {
			textures_.emplace_back(std::shared_ptr<PolledTexture>(new PolledTexture(t.w, t.h, t.pixel_type)));
		} else {
			textures_.emplace_back(resources_.getTexture(t.file));
		}
	}

	for (const auto& f: pipeline->framebuffers) {
		Framebuffer fb;
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb.name));
		for (int i = 0; i < f.textures_count; ++i) {
			const int index = f.textures[i];
			if (index < 0 || index >= (int)textures_.size())
				CRASH("Fb texture %d OOB %d (max %d)", i, index, (int)textures_.size());

			if (!fb.attachColorTexture(i, textures_[index]->texture()))
				CRASH("Framebuffer %d is not complete", (int)framebuffer_.size());
		}

		fb.num_targets = f.textures_count;

		framebuffer_.push_back(std::move(fb));
	}

	GL(glBindFramebuffer(GL_FRAMEBUFFER, 0));

	for (const auto& s: pipeline->shader_filenames)
		sources_.emplace_back(resources_.getShaderSource(s));

	for (const auto& p: pipeline->programs) {
		if (p.vertex < 0 || p.vertex >= (int)sources_.size())
			CRASH("Program vertex source OOB %d (max %d)", p.vertex, (int)sources_.size());
		if (p.fragment < 0 || p.fragment >= (int)sources_.size())
			CRASH("Program fragment source OOB %d (max %d)", p.fragment, (int)sources_.size());

		programs_.emplace_back(shaderPreprocessor, sources_[p.vertex], sources_[p.fragment]);
	}
}